

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::PRE::RemoveOverlyOptimisticInitialValues(PRE *this,Loop *loop)

{
  ValueNumber VVar1;
  BasicBlock *pBVar2;
  PropertySym *sym;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  EntryType *pEVar6;
  Value *pVVar7;
  GlobOptBlockData *this_00;
  undefined1 local_78 [8];
  BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  it;
  
  pBVar2 = loop->landingPad;
  JsUtil::
  BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::BucketEntryIterator
            ((BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              *)local_78,&loop->initialValueFieldMap);
  bVar4 = JsUtil::
          BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::
          BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
          ::IsValid((BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                     *)local_78);
  if (bVar4) {
    this_00 = &pBVar2->globOptData;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    it._56_8_ = this_00;
    do {
      pEVar6 = JsUtil::
               BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               IteratorBase<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               ::Current((IteratorBase<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                          *)local_78);
      sym = (pEVar6->
            super_DefaultHashedEntry<PropertySym_*,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            ).super_KeyValueEntry<PropertySym_*,_Value_*>.
            super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<PropertySym_*,_Value_*>_>
            .super_KeyValueEntryDataLayout2<PropertySym_*,_Value_*>.key;
      bVar4 = GlobOptBlockData::IsLive(this_00,&sym->m_stackSym->super_Sym);
      if (!bVar4) {
        pVVar7 = GlobOptBlockData::FindValue(this_00,&sym->super_Sym);
        if (pVVar7 == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x463b,"(landingPadPropSymValue)","landingPadPropSymValue");
          if (!bVar4) goto LAB_00475fa7;
          *puVar5 = 0;
        }
        VVar1 = pVVar7->valueNumber;
        pEVar6 = JsUtil::
                 BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_78);
        if (VVar1 != ((pEVar6->
                      super_DefaultHashedEntry<PropertySym_*,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                      ).super_KeyValueEntry<PropertySym_*,_Value_*>.
                      super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<PropertySym_*,_Value_*>_>
                      .super_KeyValueEntryDataLayout2<PropertySym_*,_Value_*>.value)->valueNumber) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x463c,
                             "(landingPadPropSymValue->GetValueNumber() == it.CurrentValue()->GetValueNumber())"
                             ,
                             "landingPadPropSymValue->GetValueNumber() == it.CurrentValue()->GetValueNumber()"
                            );
          if (!bVar4) goto LAB_00475fa7;
          *puVar5 = 0;
        }
        this_00 = (GlobOptBlockData *)it._56_8_;
        if ((PropertySym *)pVVar7->valueInfo->symStore != sym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x463d,
                             "(landingPadPropSymValue->GetValueInfo()->GetSymStore() == propertySym)"
                             ,"landingPadPropSymValue->GetValueInfo()->GetSymStore() == propertySym"
                            );
          if (!bVar4) {
LAB_00475fa7:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar5 = 0;
        }
        GlobOptBlockData::ClearSymValue(this_00,&sym->super_Sym);
        JsUtil::
        BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::
        BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
        ::RemoveCurrent((BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)local_78);
      }
      JsUtil::
      BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_78);
      bVar4 = JsUtil::
              BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::IsValid((BucketEntryIterator<JsUtil::BaseDictionary<PropertySym_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                         *)local_78);
    } while (bVar4);
  }
  return;
}

Assistant:

void GlobOpt::PRE::RemoveOverlyOptimisticInitialValues(Loop * loop)
{
    BasicBlock * landingPad = loop->landingPad;

    // For a property sym whose obj ptr sym wasn't live in the landing pad, we can optimistically (if the obj ptr sym was
    // single def) insert an initial value in the landing pad, with the hope that PRE could make the obj ptr sym live. 
    // But, if PRE couldn't make the obj ptr sym live, we need to clear the value for the property sym from the landing pad

    for (auto it = loop->initialValueFieldMap.GetIteratorWithRemovalSupport(); it.IsValid(); it.MoveNext())
    {
        PropertySym * propertySym = it.CurrentKey();

        StackSym * objPtrSym = propertySym->m_stackSym;
        if (!landingPad->globOptData.IsLive(objPtrSym))
        {
            Value * landingPadPropSymValue = landingPad->globOptData.FindValue(propertySym);
            Assert(landingPadPropSymValue);
            Assert(landingPadPropSymValue->GetValueNumber() == it.CurrentValue()->GetValueNumber());
            Assert(landingPadPropSymValue->GetValueInfo()->GetSymStore() == propertySym);

            landingPad->globOptData.ClearSymValue(propertySym);
            it.RemoveCurrent();
        }
    }
}